

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::Decode
          (IFF_ATC_NAVAIDS_FundamentalParameterData *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  IFF_ATC_NAVAIDS_FundamentalParameterData *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x18) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,(float *)&this->m_f32ERP);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Freq);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PgRF);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PulseWidth);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32BurstLength);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8AppMode);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  KDataStream::operator>>(pKVar2,&this->m_ui8Padding2);
  return;
}

Assistant:

void IFF_ATC_NAVAIDS_FundamentalParameterData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_ATC_NAVAIDS_FUNDAMENTAL_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32ERP
           >> m_f32Freq
           >> m_f32PgRF
           >> m_f32PulseWidth
           >> m_ui32BurstLength
           >> m_ui8AppMode
           >> m_ui16Padding1
           >> m_ui8Padding2;
}